

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::CalcWrapWidthForPos(ImVec2 *pos,float wrap_pos_x)

{
  ImGuiWindow *pIVar1;
  float *in_RDI;
  float in_XMM0_Da;
  ImGuiWindow *window;
  float local_14;
  float local_4;
  
  if (0.0 <= in_XMM0_Da) {
    pIVar1 = GImGui->CurrentWindow;
    if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
      local_14 = in_XMM0_Da;
      if (0.0 < in_XMM0_Da) {
        local_14 = ((pIVar1->Pos).x - (pIVar1->Scroll).x) + in_XMM0_Da;
      }
    }
    else {
      local_14 = (pIVar1->WorkRect).Max.x;
    }
    local_4 = ImMax<float>(local_14 - *in_RDI,1.0);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float ImGui::CalcWrapWidthForPos(const ImVec2& pos, float wrap_pos_x)
{
    if (wrap_pos_x < 0.0f)
        return 0.0f;

    ImGuiWindow* window = GImGui->CurrentWindow;
    if (wrap_pos_x == 0.0f)
        wrap_pos_x = window->WorkRect.Max.x;
    else if (wrap_pos_x > 0.0f)
        wrap_pos_x += window->Pos.x - window->Scroll.x; // wrap_pos_x is provided is window local space

    return ImMax(wrap_pos_x - pos.x, 1.0f);
}